

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::string_t,int,duckdb::UnaryOperatorWrapper,duckdb::AsciiOperator>
               (string_t *ldata,int *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  string_t input;
  string_t input_00;
  bool bVar1;
  int iVar2;
  idx_t iVar3;
  idx_t *piVar4;
  SelectionVector *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  idx_t idx_1;
  idx_t i_1;
  idx_t idx;
  idx_t i;
  idx_t in_stack_ffffffffffffff88;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  ulong idx_00;
  idx_t in_stack_ffffffffffffffa8;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb0;
  ulong local_40;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8);
  if (bVar1) {
    for (idx_00 = 0; idx_00 < in_RDX; idx_00 = idx_00 + 1) {
      iVar3 = SelectionVector::get_index(in_RCX,idx_00);
      piVar4 = (idx_t *)(in_RDI + iVar3 * 0x10);
      input_00.value.pointer.ptr = (char *)idx_00;
      input_00.value._0_8_ = iVar3;
      iVar2 = UnaryOperatorWrapper::Operation<duckdb::AsciiOperator,duckdb::string_t,int>
                        (input_00,(ValidityMask *)piVar4[1],*piVar4,(void *)0x2190512);
      *(int *)(in_RSI + idx_00 * 4) = iVar2;
    }
  }
  else {
    for (local_40 = 0; local_40 < in_RDX; local_40 = local_40 + 1) {
      iVar3 = SelectionVector::get_index(in_RCX,local_40);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValidUnsafe
                        (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (bVar1) {
        piVar4 = (idx_t *)(in_RDI + iVar3 * 0x10);
        in_stack_ffffffffffffffa8 = *piVar4;
        in_stack_ffffffffffffffb0 = (TemplatedValidityMask<unsigned_long> *)piVar4[1];
        input.value.pointer.ptr = (char *)in_stack_ffffffffffffffa0;
        input.value._0_8_ = in_stack_ffffffffffffff98;
        iVar2 = UnaryOperatorWrapper::Operation<duckdb::AsciiOperator,duckdb::string_t,int>
                          (input,(ValidityMask *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                           ,(void *)0x219046e);
        *(int *)(in_RSI + local_40 * 4) = iVar2;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}